

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendString(MinimalFormatter *this,char *str)

{
  bool bVar1;
  int local_1c;
  int i;
  char *str_local;
  MinimalFormatter *this_local;
  
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if (str[local_1c] != '\0') {
      bVar1 = this->cursor_ + local_1c < this->end_;
    }
    if (!bVar1) break;
    this->cursor_[local_1c] = str[local_1c];
    local_1c = local_1c + 1;
  }
  this->cursor_ = this->cursor_ + local_1c;
  return;
}

Assistant:

void AppendString(const char* str) {
    int i = 0;
    while (str[i] != '\0' && cursor_ + i < end_) {
      cursor_[i] = str[i];
      ++i;
    }
    cursor_ += i;
  }